

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_add(Curl_easy *data,Curl_creader *reader)

{
  bool bVar1;
  Curl_creader **local_30;
  Curl_creader **anchor;
  CURLcode result;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  local_30 = &(data->req).reader_stack;
  if ((*local_30 != (Curl_creader *)0x0) ||
     (data_local._4_4_ = Curl_creader_set_fread(data,(data->state).infilesize),
     data_local._4_4_ == CURLE_OK)) {
    while( true ) {
      bVar1 = false;
      if (*local_30 != (Curl_creader *)0x0) {
        bVar1 = (*local_30)->phase < reader->phase;
      }
      if (!bVar1) break;
      local_30 = &(*local_30)->next;
    }
    reader->next = *local_30;
    *local_30 = reader;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_creader_add(struct Curl_easy *data,
                          struct Curl_creader *reader)
{
  CURLcode result;
  struct Curl_creader **anchor = &data->req.reader_stack;

  if(!*anchor) {
    result = Curl_creader_set_fread(data, data->state.infilesize);
    if(result)
      return result;
  }

  /* Insert the writer as first in its phase.
   * Skip existing readers of lower phases. */
  while(*anchor && (*anchor)->phase < reader->phase)
    anchor = &((*anchor)->next);
  reader->next = *anchor;
  *anchor = reader;
  return CURLE_OK;
}